

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  int iVar1;
  int local_94;
  size_t sStack_90;
  int ret;
  size_t len;
  secp256k1_ge Q;
  uint flags_local;
  secp256k1_pubkey *pubkey_local;
  size_t *outputlen_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  local_94 = 0;
  Q.y.n[9] = flags;
  unique0x1000015f = pubkey;
  if (outputlen == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"outputlen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = 0x41;
    if ((flags & 0x100) != 0) {
      iVar1 = 0x21;
    }
    if (*outputlen < (ulong)(long)iVar1) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33 : 65)");
      ctx_local._4_4_ = 0;
    }
    else {
      sStack_90 = *outputlen;
      *outputlen = 0;
      if (output == (uchar *)0x0) {
        secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
        ctx_local._4_4_ = 0;
      }
      else {
        memset(output,0,sStack_90);
        if (stack0xffffffffffffffd0 == (secp256k1_pubkey *)0x0) {
          secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
          ctx_local._4_4_ = 0;
        }
        else if ((Q.y.n[9] & 0xff) == 2) {
          iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&len,stack0xffffffffffffffd0);
          if ((iVar1 != 0) &&
             (local_94 = secp256k1_eckey_pubkey_serialize
                                   ((secp256k1_ge *)&len,output,&stack0xffffffffffffff70,
                                    Q.y.n[9] & 0x100), local_94 != 0)) {
            *outputlen = sStack_90;
          }
          ctx_local._4_4_ = local_94;
        }
        else {
          secp256k1_callback_call
                    (&ctx->illegal_callback,
                     "(flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION");
          ctx_local._4_4_ = 0;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33 : 65));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, flags & SECP256K1_FLAGS_BIT_COMPRESSION);
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}